

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

mp_limb_t mpn_neg(mp_ptr rp,mp_srcptr up,mp_size_t n)

{
  mp_limb_t mVar1;
  long lVar2;
  long lVar3;
  
  mVar1 = *up;
  if (mVar1 == 0) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      rp[lVar3] = 0;
      if (n + -1 == lVar3) {
        return 0;
      }
      mVar1 = up[lVar3 + 1];
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + -8;
    } while (mVar1 == 0);
    n = n - lVar3;
    up = (mp_srcptr)((long)up - lVar2);
    rp = (mp_ptr)((long)rp - lVar2);
  }
  *rp = -mVar1;
  if (1 < n) {
    lVar3 = n + 1;
    lVar2 = 8;
    do {
      *(ulong *)((long)rp + lVar2) = ~*(ulong *)((long)up + lVar2);
      lVar3 = lVar3 + -1;
      lVar2 = lVar2 + 8;
    } while (2 < lVar3);
  }
  return 1;
}

Assistant:

mp_limb_t
mpn_neg (mp_ptr rp, mp_srcptr up, mp_size_t n)
{
  while (*up == 0)
    {
      *rp = 0;
      if (!--n)
	return 0;
      ++up; ++rp;
    }
  *rp = - *up;
  mpn_com (++rp, ++up, --n);
  return 1;
}